

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op.h
# Opt level: O3

void yyml::nn::Multiply<double>(Variable<double> *va,Variable<double> *vb,Variable<double> *result)

{
  size_t sVar1;
  double *pdVar2;
  double *pdVar3;
  double *pdVar4;
  size_t sVar5;
  _Bind<void_(*(yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*))(yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*)>
  local_40;
  
  local_40._M_f = MultiplyBackward<double>;
  local_40._M_bound_args.
  super__Tuple_impl<0UL,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*>
  .super__Tuple_impl<1UL,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*>.
  super__Tuple_impl<2UL,_yyml::nn::Variable<double>_*>.
  super__Head_base<2UL,_yyml::nn::Variable<double>_*,_false>._M_head_impl =
       (_Head_base<2UL,_yyml::nn::Variable<double>_*,_false>)
       (_Head_base<2UL,_yyml::nn::Variable<double>_*,_false>)result;
  local_40._M_bound_args.
  super__Tuple_impl<0UL,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*>
  .super__Tuple_impl<1UL,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*>.
  super__Head_base<1UL,_yyml::nn::Variable<double>_*,_false>._M_head_impl = vb;
  local_40._M_bound_args.
  super__Tuple_impl<0UL,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*>
  .super__Head_base<0UL,_yyml::nn::Variable<double>_*,_false>._M_head_impl = va;
  std::function<void()>::operator=((function<void()> *)&(result->autograd_).backward_fn,&local_40);
  local_40._M_f =
       (_func_void_Variable<double>_ptr_Variable<double>_ptr_Variable<double>_ptr *)&va->autograd_;
  local_40._M_bound_args.
  super__Tuple_impl<0UL,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*>
  .super__Tuple_impl<1UL,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*>.
  super__Tuple_impl<2UL,_yyml::nn::Variable<double>_*>.
  super__Head_base<2UL,_yyml::nn::Variable<double>_*,_false>._M_head_impl =
       (_Head_base<2UL,_yyml::nn::Variable<double>_*,_false>)&vb->autograd_;
  std::vector<yyml::nn::Autograd<double>*,std::allocator<yyml::nn::Autograd<double>*>>::
  _M_assign_aux<yyml::nn::Autograd<double>*const*>
            ((vector<yyml::nn::Autograd<double>*,std::allocator<yyml::nn::Autograd<double>*>> *)
             &result->autograd_,&local_40,
             &local_40._M_bound_args.
              super__Tuple_impl<0UL,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*>
              .super__Tuple_impl<1UL,_yyml::nn::Variable<double>_*,_yyml::nn::Variable<double>_*>.
              super__Head_base<1UL,_yyml::nn::Variable<double>_*,_false>);
  sVar1 = (va->values_).shape_.total;
  if (sVar1 != 0) {
    pdVar2 = (va->values_).data_;
    pdVar3 = (vb->values_).data_;
    pdVar4 = (result->values_).data_;
    sVar5 = 0;
    do {
      pdVar4[sVar5] = pdVar2[sVar5] * pdVar3[sVar5];
      sVar5 = sVar5 + 1;
    } while (sVar1 != sVar5);
  }
  return;
}

Assistant:

void Multiply(Variable<Type>* va, Variable<Type>* vb, Variable<Type>* result) {
  result->autograd_.backward_fn =
      std::bind(MultiplyBackward<Type>, va, vb, result);
  result->autograd_.next = {&va->autograd_, &vb->autograd_};
  for (size_t i = 0; i < va->values_.total(); i++) {
    result->values_.data_[i] = va->values_.data_[i] * vb->values_.data_[i];
  }
}